

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IterativeAlgorithm.cpp
# Opt level: O3

void __thiscall
van_kampen::IterativeAlgorithm::generate
          (IterativeAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words_)

{
  ulong uVar1;
  size_t sVar2;
  ostream *poVar3;
  ulong __n;
  ulong total;
  bool isAdditionForced;
  size_t totalIterations;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  anon_class_56_7_b2ce0729 iterateOverWordsOnce;
  ProcessLogger logger;
  bool local_111;
  size_t local_110;
  size_t local_108;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  local_100;
  undefined1 local_e8 [32];
  IterativeAlgorithm *local_c8;
  bool *local_c0;
  size_t *local_b8;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_b0;
  vector<bool,_std::allocator<bool>_> local_98;
  ProcessLogger local_70;
  
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::vector(&local_100,words_);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
            (local_100.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_100.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __n = ((long)local_100.
               super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_100.
               super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar1 = this->cellsLimit;
  total = __n;
  if ((uVar1 != 0) && (total = uVar1, __n <= uVar1)) {
    total = __n;
  }
  local_70.total_._0_1_ = 0;
  local_108 = total;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_98,__n,(bool *)&local_70,(allocator_type *)local_e8);
  local_111 = false;
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Relations used","");
  ProcessLogger::ProcessLogger(&local_70,total,(ostream *)&std::clog,(string *)local_e8,this->quiet)
  ;
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  *local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
   super__Bit_iterator_base._M_p =
       *local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p | 1;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_b0,
             local_100.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  Diagramm::bindWord(&this->diagramm_,&local_b0,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_b0);
  ProcessLogger::iterate(&local_70);
  local_e8._16_8_ = &local_108;
  local_c0 = &local_111;
  local_b8 = &local_110;
  local_e8._0_8_ = &local_100;
  local_e8._8_8_ = &local_70;
  local_e8._24_8_ = &local_98;
  local_c8 = this;
  do {
    local_110 = 0;
    generate::anon_class_56_7_b2ce0729::operator()((anon_class_56_7_b2ce0729 *)local_e8);
  } while (local_110 != 0);
  local_111 = true;
  do {
    local_110 = 0;
    generate::anon_class_56_7_b2ce0729::operator()((anon_class_56_7_b2ce0729 *)local_e8);
  } while (local_110 != 0);
  sVar2 = ProcessLogger::getIteration(&local_70);
  if ((sVar2 < local_108) && (this->quiet == false)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"can not bind ",0xd);
    ProcessLogger::getIteration(&local_70);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," relations, finishing",0x15);
  }
  ProcessLogger::~ProcessLogger(&local_70);
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector(&local_100);
  return;
}

Assistant:

void IterativeAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words_)
{
    auto words = words_;
    std::reverse(words.begin(), words.end());
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    std::vector<bool> isAdded(words.size());
    bool isAdditionForced = false;
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);
    std::size_t increase = 0;
    isAdded.front() = true;
    diagramm_.bindWord(words.front(), false, true);
    logger.iterate();
    auto iterateOverWordsOnce = [&]() {
        for (std::size_t i = 0; i < words.size(); ++i)
        {
            if (logger.getIteration() >= totalIterations)
            {
                break;
            }
            if (isAdded[i])
                continue;
            if (diagramm_.bindWord(words[i], isAdditionForced, false))
            {
                isAdded[i] = true;
                increase += 1;
                if (logger.iterate() >= totalIterations)
                {
                    break;
                }
            }
        }
    };
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    isAdditionForced = true;
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    if (logger.getIteration() < totalIterations && !quiet)
    {
        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
    }
}